

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_examples.cpp
# Opt level: O3

void density_tests::
     LfQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
     ::samples(ostream *param_1)

{
  pointer pcVar1;
  char *__s;
  undefined8 uVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  ControlBlock *pCVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  void *pvVar8;
  long lVar9;
  undefined8 *puVar10;
  runtime_type<> *prVar11;
  MessageInABottle *pMVar12;
  size_t sVar13;
  int *piVar14;
  ostream *poVar15;
  reentrant_put_transaction<int> put_1;
  string my_string;
  LfQueue queue;
  reentrant_put_transaction<void> put_3;
  double pi;
  undefined1 local_220 [16];
  void *local_210;
  __base_type _Stack_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [48];
  atomic<density::detail::LfQueueControl_*> local_1c0;
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  local_180;
  Consume local_100;
  reentrant_put_transaction<int> local_e0;
  undefined1 local_c0 [16];
  ulong local_b0;
  reentrant_put_transaction<void> local_a0;
  undefined8 local_80 [10];
  
  local_100.m_control = (ControlBlock *)local_100.m_queue;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_200._0_4_ = 0x13;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_180,(int *)local_200);
  local_200._0_4_ = 8;
  local_220[0] = 0x2a;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<std::__cxx11::string,int,char>
            ((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_180,(int *)local_200,local_220);
  local_210 = (void *)0x0;
  local_220 = ZEXT816(0);
  density::detail::
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::Consume::start_consume_impl((Consume *)local_220,&local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::element<int>((consume_operation *)local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit((consume_operation *)local_220);
  local_1f0._0_8_ = (void *)0x0;
  local_200 = ZEXT816(0);
  density::detail::
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::Consume::start_consume_impl((Consume *)local_200,&local_180);
  pvVar8 = local_210;
  uVar2 = local_220._0_8_;
  uVar3 = local_220._8_8_;
  local_220 = local_200;
  local_200._0_8_ = uVar2;
  local_200._8_8_ = uVar3;
  local_210 = (void *)local_1f0._0_8_;
  local_1f0._0_8_ = pvVar8;
  if ((void *)0xf < pvVar8) {
    LOCK();
    *(uintptr_t *)uVar3 = (long)pvVar8 - 2;
    UNLOCK();
  }
  pbVar7 = density::
           lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
           ::consume_operation::element<std::__cxx11::string>((consume_operation *)local_220);
  local_200._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)local_1f0;
  pcVar1 = (pbVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,pcVar1,pcVar1 + pbVar7->_M_string_length);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit((consume_operation *)local_220);
  if ((LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
       *)local_200._0_8_ !=
      (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
       *)local_1f0) {
    operator_delete((void *)local_200._0_8_);
  }
  if ((void *)0xf < local_210) {
    LOCK();
    *(uintptr_t *)local_220._8_8_ = (long)local_210 - 2;
    UNLOCK();
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  start_emplace<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
            ((put_transaction<MessageInABottle> *)local_220,
             (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_180);
  local_200 = local_220;
  local_1f0._0_8_ = local_210;
  local_1f0._8_8_ = _Stack_208._M_p;
  local_210 = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::~put_transaction
            ((put_transaction<MessageInABottle> *)local_220);
  pvVar8 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::put_transaction<MessageInABottle>::raw_allocate
                     ((put_transaction<MessageInABottle> *)local_200,0xd,1);
  lVar9 = 0;
  do {
    *(char *)((long)pvVar8 + lVar9) = "Hello world!"[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xd);
  puVar10 = (undefined8 *)
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::put_transaction<MessageInABottle>::element_ptr
                      ((put_transaction<MessageInABottle> *)local_200);
  *puVar10 = pvVar8;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::commit((put_transaction<MessageInABottle> *)local_200);
  local_220 = (undefined1  [16])0x0;
  local_210 = (void *)0x0;
  density::detail::
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::Consume::start_consume_impl((Consume *)local_220,&local_180);
  prVar11 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::consume_operation::complete_type((consume_operation *)local_220);
  if (prVar11->m_feature_table ==
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
      ::s_table) {
    pbVar7 = density::
             lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
             ::consume_operation::element<std::__cxx11::string>((consume_operation *)local_220);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  }
  else {
    prVar11 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::complete_type((consume_operation *)local_220);
    if (prVar11->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
        ::s_table) goto LAB_00b27aba;
    pMVar12 = density::
              lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              ::consume_operation::
              element<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
                        ((consume_operation *)local_220);
    __s = pMVar12->m_text;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1069148);
    }
    else {
      sVar13 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar13);
    }
    poVar15 = (ostream *)&std::cout;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  }
  std::ostream::put((char)poVar15);
  std::ostream::flush();
LAB_00b27aba:
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit((consume_operation *)local_220);
  if ((void *)0xf < local_210) {
    LOCK();
    *(uintptr_t *)local_220._8_8_ = (long)local_210 - 2;
    UNLOCK();
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::~put_transaction
            ((put_transaction<MessageInABottle> *)local_200);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_1f0._0_8_ = (void *)0x0;
  local_200._0_8_ = 0.0;
  local_200._8_4_ = 0;
  local_200._12_4_ = 0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_200,&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x97e,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_200._8_8_ = 0;
  local_200._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)local_1f0;
  local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)&local_180,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  if ((LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
       *)local_200._0_8_ !=
      (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
       *)local_1f0) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._8_4_ = 1;
  local_200._0_8_ = 0x4010000000000000;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)&local_180,(pair<double,_int> *)local_200);
  local_1c0._M_b._M_p = (__base_type)(__base_type)local_180.m_head;
  local_200._8_8_ =
       local_180.
       super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
       .m_initial_page._M_b._M_p;
  local_200._0_8_ =
       local_180.
       super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
       .m_tail;
  LOCK();
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  local_180.m_head = (ControlBlock *)0x0;
  UNLOCK();
  LOCK();
  UNLOCK();
  bVar6 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                   *)&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x991,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar6 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                   *)local_200);
  if (bVar6) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x992,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)local_200);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_1f0._0_8_ = (void *)0x0;
  local_200._0_8_ = 0.0;
  local_200._8_4_ = 0;
  local_200._12_4_ = 0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_200,&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x99f,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_1f0._0_8_ = (void *)0x0;
  local_200._0_8_ = 0.0;
  local_200._8_4_ = 0;
  local_200._12_4_ = 0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_200,&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9ad,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_200._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"abc","");
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_180,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  if ((LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
       *)local_200._0_8_ !=
      (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
       *)local_1f0) {
    operator_delete((void *)local_200._0_8_);
  }
  local_200._8_4_ = 1;
  local_200._0_8_ = 0x4010000000000000;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_180,(pair<double,_int> *)local_200);
  local_200._8_8_ =
       local_180.
       super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
       .m_initial_page._M_b._M_p;
  local_200._0_8_ =
       local_180.
       super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
       .m_tail;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  LOCK();
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  UNLOCK();
  LOCK();
  UNLOCK();
  local_1c0._M_b._M_p = (__base_type)(__base_type)local_180.m_head;
  local_180.m_head = (ControlBlock *)0x0;
  local_210 = (void *)0x0;
  local_220 = (undefined1  [16])0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty
                    ((Consume *)local_220,
                     (LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                      *)&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9c8,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  local_220 = (undefined1  [16])0x0;
  local_210 = (void *)0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty
                    ((Consume *)local_220,
                     (LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                      *)local_200);
  if (bVar6) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9ca,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)local_200);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_200 = ZEXT816(0xffc0);
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_220._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_180,(int *)local_220);
  pCVar5 = local_180.m_head;
  uVar4 = local_180.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          .m_tail;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = local_200._0_8_;
  uVar2 = local_200._8_8_;
  LOCK();
  local_200._0_8_ = uVar4;
  local_200._8_8_ =
       local_180.
       super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
       .m_initial_page._M_b._M_p;
  UNLOCK();
  LOCK();
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__base_type)uVar2;
  UNLOCK();
  local_180.m_head = (ControlBlock *)local_1c0._M_b._M_p;
  local_1c0._M_b._M_p = (__base_type)(__base_type)pCVar5;
  local_220 = (undefined1  [16])0x0;
  local_210 = (void *)0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_220,&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa03,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  local_220 = (undefined1  [16])0x0;
  local_210 = (void *)0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty
                    ((Consume *)local_220,
                     (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                      *)local_200);
  if (bVar6) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa04,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)local_200);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_200 = ZEXT816(0xffc0);
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_220._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_180,(int *)local_220);
  pCVar5 = local_180.m_head;
  uVar4 = local_180.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          .m_tail;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = local_200._0_8_;
  uVar2 = local_200._8_8_;
  LOCK();
  local_200._8_8_ =
       local_180.
       super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
       .m_initial_page._M_b._M_p;
  local_200._0_8_ = uVar4;
  UNLOCK();
  LOCK();
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__base_type)uVar2;
  UNLOCK();
  local_180.m_head = (ControlBlock *)local_1c0._M_b._M_p;
  local_1c0._M_b._M_p = (__base_type)(__base_type)pCVar5;
  local_220 = (undefined1  [16])0x0;
  local_210 = (void *)0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_220,&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa16,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  local_220 = (undefined1  [16])0x0;
  local_210 = (void *)0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty
                    ((Consume *)local_220,
                     (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                      *)local_200);
  if (bVar6) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa17,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)local_200);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_1f0._0_8_ = (void *)0x0;
  local_200._0_8_ = 0.0;
  local_200._8_4_ = 0;
  local_200._12_4_ = 0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_200,&local_180);
  if (!bVar6) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa24,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  local_200._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_180,(int *)local_200);
  local_200._0_8_ = 0.0;
  local_200._8_4_ = 0;
  local_200._12_4_ = 0;
  local_1f0._0_8_ = (void *)0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_200,&local_180);
  if (bVar6) {
    __assert_fail("!queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa26,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_180);
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_180.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_head = (ControlBlock *)0x0;
  local_200._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_180,(int *)local_200);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::clear((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           *)&local_180);
  local_200._0_8_ = 0.0;
  local_200._8_4_ = 0;
  local_200._12_4_ = 0;
  local_1f0._0_8_ = (void *)0x0;
  bVar6 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::is_queue_empty((Consume *)local_200,&local_180);
  if (bVar6) {
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_180);
    local_180.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_tail = 0xffc0;
    local_180.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_180.m_head = (ControlBlock *)0x0;
    bVar6 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_180);
    if (bVar6) {
      __assert_fail("pop_result == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa44,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_200._0_4_ = 1;
    density::
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                        *)&local_180,(int *)local_200);
    local_200._0_4_ = 2;
    density::
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                        *)&local_180,(int *)local_200);
    bVar6 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_180);
    if (!bVar6) {
      __assert_fail("pop_result == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa4a,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_200._0_8_ = 0.0;
    local_200._8_4_ = 0;
    local_200._12_4_ = 0;
    local_1f0._0_8_ = (void *)0x0;
    density::detail::
    LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    ::Consume::start_consume_impl((Consume *)local_200,&local_180);
    piVar14 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::element<int>((consume_operation *)local_200);
    if (*piVar14 != 2) {
      __assert_fail("consume.template element<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa4c,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit((consume_operation *)local_200);
    if ((void *)0xf < (ulong)local_1f0._0_8_) {
      LOCK();
      *(ulong *)local_200._8_8_ = local_1f0._0_8_ - 2;
      UNLOCK();
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_180);
    local_180.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_tail = 0xffc0;
    local_180.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_180.m_head = (ControlBlock *)0x0;
    local_1f0._0_8_ = (void *)0x0;
    local_200._0_8_ = 0.0;
    local_200._8_4_ = 0;
    local_200._12_4_ = 0;
    density::detail::
    LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    ::Consume::start_consume_impl((Consume *)local_200,&local_180);
    if ((void *)0xf < (ulong)local_1f0._0_8_) {
      __assert_fail("!consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa5c,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_220._0_4_ = 0x2a;
    density::
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                        *)&local_180,(int *)local_220);
    local_220 = (undefined1  [16])0x0;
    local_210 = (void *)0x0;
    density::detail::
    LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    ::Consume::start_consume_impl((Consume *)local_220,&local_180);
    if (local_210 < (void *)0x10) {
      __assert_fail("consume_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa61,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    piVar14 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::element<int>((consume_operation *)local_220);
    if (*piVar14 != 0x2a) {
      __assert_fail("consume_2.template element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa62,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit((consume_operation *)local_220);
    if ((void *)0xf < local_210) {
      LOCK();
      *(uintptr_t *)local_220._8_8_ = (long)local_210 - 2;
      UNLOCK();
    }
    if ((void *)0xf < (ulong)local_1f0._0_8_) {
      LOCK();
      *(ulong *)local_200._8_8_ = local_1f0._0_8_ - 2;
      UNLOCK();
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_180);
    local_180.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_tail = 0xffc0;
    local_180.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_180.m_head = (ControlBlock *)0x0;
    local_1f0._0_8_ = (void *)0x0;
    local_200._0_8_ = 0.0;
    local_200._8_4_ = 0;
    local_200._12_4_ = 0;
    density::detail::
    LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    ::Consume::start_consume_impl((Consume *)local_200,&local_180);
    if ((void *)0xf < (ulong)local_1f0._0_8_) {
      __assert_fail("!bool_1 && !consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa73,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_220._0_4_ = 0x2a;
    density::
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                        *)&local_180,(int *)local_220);
    local_220 = (undefined1  [16])0x0;
    local_210 = (void *)0x0;
    density::detail::
    LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    ::Consume::start_consume_impl((Consume *)local_220,&local_180);
    if (local_210 < (void *)0x10) {
      __assert_fail("consume_2 && bool_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa79,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    piVar14 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::element<int>((consume_operation *)local_220);
    if (*piVar14 == 0x2a) {
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::commit((consume_operation *)local_220);
      if ((void *)0xf < local_210) {
        LOCK();
        *(uintptr_t *)local_220._8_8_ = (long)local_210 - 2;
        UNLOCK();
      }
      if ((void *)0xf < (ulong)local_1f0._0_8_) {
        LOCK();
        *(ulong *)local_200._8_8_ = local_1f0._0_8_ - 2;
        UNLOCK();
      }
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                         *)&local_180);
      local_180.
      super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      .m_tail = 0xffc0;
      local_180.
      super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_180.m_head = (ControlBlock *)0x0;
      local_a0.m_put.m_control_block._0_4_ = 1;
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
      ::start_reentrant_emplace<int,int>
                ((reentrant_put_transaction<int> *)local_200,
                 (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                  *)&local_180,(int *)&local_a0);
      local_e0.m_put.m_control_block = (LfQueueControl *)local_200._0_8_;
      local_e0.m_put.m_next_ptr = local_200._8_8_;
      local_e0.m_put.m_user_storage = (void *)local_1f0._0_8_;
      local_e0.m_queue =
           (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            *)local_1f0._8_8_;
      local_1f0._0_8_ = (void *)0x0;
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<int>::~reentrant_put_transaction
                ((reentrant_put_transaction<int> *)local_200);
      local_220._8_8_ = local_e0.m_put.m_next_ptr;
      local_220._0_8_ = local_e0.m_put.m_control_block;
      local_210 = local_e0.m_put.m_user_storage;
      _Stack_208._M_p = (__pointer_type)local_e0.m_queue;
      local_e0.m_put.m_user_storage = (void *)0x0;
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
      ::start_reentrant_emplace<std::__cxx11::string,char_const(&)[13]>
                ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                  *)&local_180,(char (*) [13])"Hello world!");
      local_200._8_8_ = local_e0.m_put.m_next_ptr;
      local_200._0_8_ = local_e0.m_put.m_control_block;
      local_1f0._0_8_ = local_e0.m_put.m_user_storage;
      local_1f0._8_8_ = local_e0.m_queue;
      local_e0.m_put.m_user_storage = (void *)0x0;
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~reentrant_put_transaction
                ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0);
      local_80[0] = 0x40091eb851eb851f;
      local_100.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
            *)density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,double>
              ::s_table;
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::start_reentrant_dyn_push_copy
                (&local_a0,
                 (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  *)&local_180,(runtime_type *)&local_100,local_80);
      local_e0.m_put.m_control_block = local_a0.m_put.m_control_block;
      local_e0.m_put.m_next_ptr = local_a0.m_put.m_next_ptr;
      local_e0.m_put.m_user_storage = local_a0.m_put.m_user_storage;
      local_e0.m_queue = local_a0.m_queue;
      local_a0.m_put.m_user_storage = (void *)0x0;
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_a0);
      local_a0.m_put.m_user_storage = (void *)0x0;
      local_a0.m_put.m_control_block = (LfQueueControl *)0x0;
      local_a0.m_put.m_next_ptr = 0;
      bVar6 = density::detail::
              LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              ::Consume::is_queue_empty((Consume *)&local_a0,&local_180);
      if (!bVar6) {
        __assert_fail("queue.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa91,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::commit((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_200);
      local_100.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
            *)0x0;
      local_100.m_control = (ControlBlock *)0x0;
      local_100.m_next_ptr = 0;
      density::detail::
      LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
      ::Consume::start_consume_impl(&local_100,&local_180);
      if (0xf < local_100.m_next_ptr) {
        prVar11 = density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::reentrant_consume_operation::complete_type
                            ((reentrant_consume_operation *)&local_100);
        if (prVar11->m_feature_table ==
            (tuple_type *)
            density::detail::
            FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
            ::s_table) {
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)local_220);
          local_c0 = (undefined1  [16])0x0;
          local_b0 = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::start_consume_impl((Consume *)local_c0,&local_180);
          if (0xf < local_b0) {
            prVar11 = density::
                      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                      ::reentrant_consume_operation::complete_type
                                ((reentrant_consume_operation *)local_c0);
            if (prVar11->m_feature_table ==
                (tuple_type *)
                density::detail::
                FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
                ::s_table) {
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_put_transaction<void>::cancel
                        ((reentrant_put_transaction<void> *)&local_e0);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_consume_operation::commit((reentrant_consume_operation *)local_c0);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_consume_operation::commit((reentrant_consume_operation *)&local_100);
              local_a0.m_put.m_control_block = (LfQueueControl *)0x0;
              local_a0.m_put.m_next_ptr = 0;
              local_a0.m_put.m_user_storage = (void *)0x0;
              bVar6 = density::detail::
                      LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                      ::Consume::is_queue_empty((Consume *)&local_a0,&local_180);
              if (!bVar6) {
                __assert_fail("queue.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                              ,0xaa1,
                              "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                             );
              }
              if (0xf < local_b0) {
                LOCK();
                *(uintptr_t *)local_c0._8_8_ = local_b0 - 2;
                UNLOCK();
              }
              if (0xf < local_100.m_next_ptr) {
                LOCK();
                (local_100.m_control)->m_next = local_100.m_next_ptr - 2;
                UNLOCK();
              }
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_put_transaction<void>::~reentrant_put_transaction
                        ((reentrant_put_transaction<void> *)&local_e0);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::
              reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~reentrant_put_transaction
                        ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_200);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_put_transaction<int>::~reentrant_put_transaction
                        ((reentrant_put_transaction<int> *)local_220);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                 *)&local_180);
              local_180.
              super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              .m_tail = 0xffc0;
              local_180.
              super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
              local_180.m_head = (ControlBlock *)0x0;
              bVar6 = density::
                      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                      ::try_reentrant_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                           *)&local_180);
              if (bVar6) {
                __assert_fail("pop_result == false",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                              ,0xab0,
                              "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                             );
              }
              local_200._0_4_ = 1;
              density::
              lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                  *)&local_180,(int *)local_200);
              local_200._0_4_ = 2;
              density::
              lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                  *)&local_180,(int *)local_200);
              bVar6 = density::
                      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                      ::try_reentrant_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                           *)&local_180);
              if (!bVar6) {
                __assert_fail("pop_result == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                              ,0xab6,
                              "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                             );
              }
              local_200._0_8_ = 0.0;
              local_200._8_4_ = 0;
              local_200._12_4_ = 0;
              local_1f0._0_8_ = (void *)0x0;
              density::detail::
              LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              ::Consume::start_consume_impl((Consume *)local_200,&local_180);
              piVar14 = density::
                        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                        ::reentrant_consume_operation::element<int>
                                  ((reentrant_consume_operation *)local_200);
              if (*piVar14 == 2) {
                density::
                lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                ::reentrant_consume_operation::commit((reentrant_consume_operation *)local_200);
                if ((void *)0xf < (ulong)local_1f0._0_8_) {
                  LOCK();
                  *(ulong *)local_200._8_8_ = local_1f0._0_8_ - 2;
                  UNLOCK();
                }
                density::
                lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                   *)&local_180);
                local_180.
                super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                .m_tail = 0xffc0;
                local_180.
                super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
                local_180.m_head = (ControlBlock *)0x0;
                local_1f0._0_8_ = (void *)0x0;
                local_200._0_8_ = 0.0;
                local_200._8_4_ = 0;
                local_200._12_4_ = 0;
                density::detail::
                LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                ::Consume::start_consume_impl((Consume *)local_200,&local_180);
                if ((void *)0xf < (ulong)local_1f0._0_8_) {
                  __assert_fail("!consume_1",
                                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                                ,0xac8,
                                "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                               );
                }
                local_220._0_4_ = 0x2a;
                density::
                lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                    *)&local_180,(int *)local_220);
                local_220 = (undefined1  [16])0x0;
                local_210 = (void *)0x0;
                density::detail::
                LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                ::Consume::start_consume_impl((Consume *)local_220,&local_180);
                if (local_210 < (void *)0x10) {
                  __assert_fail("consume_2",
                                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                                ,0xacd,
                                "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                               );
                }
                piVar14 = density::
                          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                          ::reentrant_consume_operation::element<int>
                                    ((reentrant_consume_operation *)local_220);
                if (*piVar14 == 0x2a) {
                  density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::reentrant_consume_operation::commit((reentrant_consume_operation *)local_220);
                  if ((void *)0xf < local_210) {
                    LOCK();
                    *(uintptr_t *)local_220._8_8_ = (long)local_210 - 2;
                    UNLOCK();
                  }
                  if ((void *)0xf < (ulong)local_1f0._0_8_) {
                    LOCK();
                    *(ulong *)local_200._8_8_ = local_1f0._0_8_ - 2;
                    UNLOCK();
                  }
                  density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                     *)&local_180);
                  local_180.
                  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  .m_tail = 0xffc0;
                  local_180.
                  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
                  local_180.m_head = (ControlBlock *)0x0;
                  local_1f0._0_8_ = (void *)0x0;
                  local_200._0_8_ = 0.0;
                  local_200._8_4_ = 0;
                  local_200._12_4_ = 0;
                  density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                  ::Consume::start_consume_impl((Consume *)local_200,&local_180);
                  if ((void *)0xf < (ulong)local_1f0._0_8_) {
                    __assert_fail("!bool_1 && !consume_1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                                  ,0xade,
                                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                                 );
                  }
                  local_220._0_4_ = 0x2a;
                  density::
                  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                      *)&local_180,(int *)local_220);
                  local_220 = (undefined1  [16])0x0;
                  local_210 = (void *)0x0;
                  density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                  ::Consume::start_consume_impl((Consume *)local_220,&local_180);
                  if (local_210 < (void *)0x10) {
                    __assert_fail("consume_2 && bool_2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                                  ,0xae4,
                                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                                 );
                  }
                  piVar14 = density::
                            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                            ::reentrant_consume_operation::element<int>
                                      ((reentrant_consume_operation *)local_220);
                  if (*piVar14 == 0x2a) {
                    density::
                    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    ::reentrant_consume_operation::commit((reentrant_consume_operation *)local_220);
                    if ((void *)0xf < local_210) {
                      LOCK();
                      *(uintptr_t *)local_220._8_8_ = (long)local_210 - 2;
                      UNLOCK();
                    }
                    if ((void *)0xf < (ulong)local_1f0._0_8_) {
                      LOCK();
                      *(ulong *)local_200._8_8_ = local_1f0._0_8_ - 2;
                      UNLOCK();
                    }
                    density::
                    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                       *)&local_180);
                    nonblocking_heterogeneous_queue_put_samples();
                    nonblocking_heterogeneous_queue_try_put_samples();
                    nonblocking_heterogeneous_queue_put_transaction_samples();
                    nonblocking_heterogeneous_queue_consume_operation_samples();
                    nonblocking_heterogeneous_queue_reentrant_put_samples();
                    nonblocking_heterogeneous_queue_reentrant_try_put_samples();
                    nonblocking_heterogeneous_queue_reentrant_put_transaction_samples();
                    nonblocking_heterogeneous_queue_reentrant_consume_operation_samples();
                    return;
                  }
                  __assert_fail("consume_2.template element<int>() == 42",
                                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                                ,0xae5,
                                "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                               );
                }
                __assert_fail("consume_2.template element<int>() == 42",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                              ,0xace,
                              "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                             );
              }
              __assert_fail("consume.template element<int>() == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xab8,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
          }
          __assert_fail("!consume1.empty() && consume1.complete_type().template is<int>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                        ,0xa9b,
                        "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                       );
        }
      }
      __assert_fail("!consume2.empty() && consume2.complete_type().template is<std::string>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa96,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    __assert_fail("consume_2.template element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa7a,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  __assert_fail("queue.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                ,0xa35,
                "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
               );
}

Assistant:

static void samples(std::ostream &)
{
    using namespace density;

    {
        //! [lf_heter_queue put example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;
        queue.push(19); // the parameter can be an l-value or an r-value
        queue.template emplace<std::string>(8, '*'); // pushes "********"
        //! [lf_heter_queue put example 1]

        //! [lf_heter_queue example 2]
        auto consume = queue.try_start_consume();
        int  my_int  = consume.template element<int>();
        consume.commit();

        consume               = queue.try_start_consume();
        std::string my_string = consume.template element<std::string>();
        consume.commit();
        //! [lf_heter_queue example 3
        (void)my_int;
        (void)my_string;
    }

    {
        //! [lf_heter_queue put example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;
        struct MessageInABottle
        {
            const char * m_text = nullptr;
        };
        auto transaction             = queue.template start_emplace<MessageInABottle>();
        transaction.element().m_text = transaction.raw_allocate_copy("Hello world!");
        transaction.commit();
        //! [lf_heter_queue put example 2]

        //! [lf_heter_queue consume example 1]
        auto consume = queue.try_start_consume();
        if (consume.complete_type().template is<std::string>())
        {
            std::cout << consume.template element<std::string>() << std::endl;
        }
        else if (consume.complete_type().template is<MessageInABottle>())
        {
            std::cout << consume.template element<MessageInABottle>().m_text << std::endl;
        }
        consume.commit();
        //! [lf_heter_queue consume example 1]
    }

    {
        //! [lf_heter_queue default_construct example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.empty());
        //! [lf_heter_queue default_construct example 1]
    }
    {
        //! [lf_heter_queue move_construct example 1]
        using MyRunTimeType = runtime_type<
          f_default_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment,
          f_equal>;

        lf_heter_queue<MyRunTimeType> queue;
        queue.push(std::string());
        queue.push(std::make_pair(4., 1));

        lf_heter_queue<MyRunTimeType> queue_1(std::move(queue));

        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue move_construct example 1]
    }
    {
        //! [lf_heter_queue construct_copy_alloc example 1]
        default_allocator allocator;
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue(allocator);
        assert(queue.empty());
        //! [lf_heter_queue construct_copy_alloc example 1]
    }
    {
        //! [lf_heter_queue construct_move_alloc example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        default_allocator allocator;
        LfQueue           queue(std::move(allocator));
        assert(queue.empty());
        //! [lf_heter_queue construct_move_alloc example 1]
    }
    {
        //! [lf_heter_queue move_assign example 1]
        using MyRunTimeType = runtime_type<
          f_default_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment,
          f_equal>;

        using LfQueue = lf_heter_queue<
          MyRunTimeType,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(std::string("abc"));
        queue.push(std::make_pair(4., 1));

        LfQueue queue_1;
        queue_1 = std::move(queue);

        assert(queue.empty());

        assert(!queue_1.empty());
        //! [lf_heter_queue move_assign example 1]
    }
    {
        //! [lf_heter_queue get_allocator example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.get_allocator() == default_allocator());
        //! [lf_heter_queue get_allocator example 1]
    }
    {
        //! [lf_heter_queue get_allocator_ref example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.get_allocator_ref() == default_allocator());
        //! [lf_heter_queue get_allocator_ref example 1]
    }
    {
        //! [lf_heter_queue get_allocator_ref example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue      queue;
        auto const & queue_ref = queue;
        assert(queue_ref.get_allocator_ref() == default_allocator());
        //! [lf_heter_queue get_allocator_ref example 2]
        (void)queue_ref;
    }
    {
        //! [lf_heter_queue swap example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue, queue_1;
        queue.push(1);
        swap(queue, queue_1);

        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue swap example 1]
    }
    {
        //! [lf_heter_queue swap example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue, queue_1;
        queue.push(1);
        {
            using namespace std;
            swap(queue, queue_1);
        }
        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue swap example 2]
    }
    {
        //! [lf_heter_queue empty example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.empty());
        queue.push(1);
        assert(!queue.empty());
        //! [lf_heter_queue empty example 1]
    }
    {
        //! [lf_heter_queue clear example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(1);
        queue.clear();
        assert(queue.empty());
        //! [lf_heter_queue clear example 1]
    }
    {
        //! [lf_heter_queue try_pop example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        bool pop_result = queue.try_pop();
        assert(pop_result == false);

        queue.push(1);
        queue.push(2);

        pop_result = queue.try_pop();
        assert(pop_result == true);
        auto consume = queue.try_start_consume();
        assert(consume.template element<int>() == 2);
        consume.commit();
        //! [lf_heter_queue try_pop example 1]
        (void)pop_result;
    }
    {
        //! [lf_heter_queue try_start_consume example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        auto    consume_1 = queue.try_start_consume();
        assert(!consume_1);

        queue.push(42);

        auto consume_2 = queue.try_start_consume();
        assert(consume_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_consume example 1]
    }
    {
        //! [lf_heter_queue try_start_consume_ example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        typename LfQueue::consume_operation consume_1;
        bool const                          bool_1 = queue.try_start_consume(consume_1);
        assert(!bool_1 && !consume_1);

        queue.push(42);

        typename LfQueue::consume_operation consume_2;
        auto                                bool_2 = queue.try_start_consume(consume_2);
        assert(consume_2 && bool_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_consume_ example 1]
        (void)bool_1;
        (void)bool_2;
    }
    {
        //! [lf_heter_queue reentrant example 1]
        // start 3 reentrant put transactions

        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        auto   put_1 = queue.start_reentrant_push(1);
        auto   put_2 = queue.template start_reentrant_emplace<std::string>("Hello world!");
        double pi    = 3.14;
        auto   put_3 = queue.start_reentrant_dyn_push_copy(runtime_type<>::make<double>(), &pi);
        assert(
          queue.empty()); // the queue is still empty, because no transaction has been committed

        // commit and start consuming "Hello world!"
        put_2.commit();
        auto consume2 = queue.try_start_reentrant_consume();
        assert(!consume2.empty() && consume2.complete_type().template is<std::string>());

        // commit and start consuming 1
        put_1.commit();
        auto consume1 = queue.try_start_reentrant_consume();
        assert(!consume1.empty() && consume1.complete_type().template is<int>());

        // cancel 3.14, and commit the consumes
        put_3.cancel();
        consume1.commit();
        consume2.commit();
        assert(queue.empty());

        //! [lf_heter_queue reentrant example 1]
    }
    {
        //! [lf_heter_queue try_reentrant_pop example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        bool pop_result = queue.try_reentrant_pop();
        assert(pop_result == false);

        queue.push(1);
        queue.push(2);

        pop_result = queue.try_reentrant_pop();
        assert(pop_result == true);
        auto consume = queue.try_start_reentrant_consume();
        assert(consume.template element<int>() == 2);
        consume.commit();
        //! [lf_heter_queue try_reentrant_pop example 1]
        (void)pop_result;
    }
    {
        //! [lf_heter_queue try_start_reentrant_consume example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        auto consume_1 = queue.try_start_reentrant_consume();
        assert(!consume_1);

        queue.push(42);

        auto consume_2 = queue.try_start_reentrant_consume();
        assert(consume_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_reentrant_consume example 1]
    }
    {
        //! [lf_heter_queue try_start_reentrant_consume_ example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        typename LfQueue::reentrant_consume_operation consume_1;
        bool const bool_1 = queue.try_start_reentrant_consume(consume_1);
        assert(!bool_1 && !consume_1);

        queue.push(42);

        typename LfQueue::reentrant_consume_operation consume_2;
        auto bool_2 = queue.try_start_reentrant_consume(consume_2);
        assert(consume_2 && bool_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_reentrant_consume_ example 1]
        (void)bool_2;
        (void)bool_1;
    }

    // this samples uses std::cout and std::cin
    // nonblocking_heterogeneous_queue_samples_1();

    nonblocking_heterogeneous_queue_put_samples();

    nonblocking_heterogeneous_queue_try_put_samples();

    nonblocking_heterogeneous_queue_put_transaction_samples();

    nonblocking_heterogeneous_queue_consume_operation_samples();

    nonblocking_heterogeneous_queue_reentrant_put_samples();

    nonblocking_heterogeneous_queue_reentrant_try_put_samples();

    nonblocking_heterogeneous_queue_reentrant_put_transaction_samples();

    nonblocking_heterogeneous_queue_reentrant_consume_operation_samples();
}